

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  tm *ptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 uVar9;
  tm time_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  int local_8c;
  string local_88;
  tm local_68;
  
  local_1d0._M_dataplus._M_p = (pointer)((long)this / 1000);
  ptVar3 = localtime_r((time_t *)&local_1d0,&local_68);
  if (ptVar3 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_8c = local_68.tm_year + 0x76c;
  StreamableToString<int>(&local_88,&local_8c);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_88,"-");
  paVar1 = &local_1b0.field_2;
  local_1b0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p == paVar5) {
    local_1b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_1b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_1b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_1b0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_(&local_b0,(String *)(ulong)(local_68.tm_mon + 1),2,(int)paVar5)
  ;
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    uVar9 = local_1b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_b0._M_string_length + local_1b0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar9 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_b0._M_string_length + local_1b0._M_string_length) goto LAB_0013f7b2;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_b0,0,0,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  }
  else {
LAB_0013f7b2:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1b0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if (paVar6 == paVar5) {
    local_270.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_270.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_270._M_dataplus._M_p = (pointer)paVar6;
  }
  local_270._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_270,"-");
  local_2b0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar5) {
    local_2b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_2b0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_
            (&local_d0,(String *)(ulong)(uint)local_68.tm_mday,2,(int)paVar5);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    uVar9 = local_2b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_d0._M_string_length + local_2b0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar9 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_d0._M_string_length + local_2b0._M_string_length) goto LAB_0013f8dc;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_d0,0,0,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  }
  else {
LAB_0013f8dc:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_2b0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if (paVar6 == paVar5) {
    local_250.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_250.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_250._M_dataplus._M_p = (pointer)paVar6;
  }
  local_250._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_250,"T");
  paVar5 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == paVar6) {
    local_190.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_190._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_190.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_190._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_
            (&local_f0,(String *)(ulong)(uint)local_68.tm_hour,2,(int)paVar6);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar5) {
    uVar9 = local_190.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_f0._M_string_length + local_190._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar9 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_f0._M_string_length + local_190._M_string_length) goto LAB_0013fa18;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f0,0,0,local_190._M_dataplus._M_p,local_190._M_string_length);
  }
  else {
LAB_0013fa18:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_190,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if (paVar7 == paVar6) {
    local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_230._M_dataplus._M_p = (pointer)paVar7;
  }
  local_230._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  paVar6->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_230,":");
  local_290._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar6) {
    local_290.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_290._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_
            (&local_110,(String *)(ulong)(uint)local_68.tm_min,2,(int)paVar6);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    uVar9 = local_290.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_110._M_string_length + local_290._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar9 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_110._M_string_length + local_290._M_string_length) goto LAB_0013fb50;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_110,0,0,local_290._M_dataplus._M_p,local_290._M_string_length);
  }
  else {
LAB_0013fb50:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_290,local_110._M_dataplus._M_p,local_110._M_string_length);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if (paVar7 == paVar6) {
    local_210.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_210.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_210.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_210._M_dataplus._M_p = (pointer)paVar7;
  }
  local_210._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  paVar6->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_210,":");
  paVar6 = &local_170.field_2;
  local_170._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p == paVar7) {
    local_170.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_170.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_170._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    local_170.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_170._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_
            (&local_130,(String *)(ulong)(uint)local_68.tm_sec,2,(int)paVar7);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar6) {
    uVar9 = local_170.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_130._M_string_length + local_170._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar9 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_130._M_string_length + local_170._M_string_length) goto LAB_0013fc9a;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_130,0,0,local_170._M_dataplus._M_p,local_170._M_string_length);
  }
  else {
LAB_0013fc9a:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_170,local_130._M_dataplus._M_p,local_130._M_string_length);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if (paVar8 == paVar7) {
    local_1f0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_1f0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1f0._M_dataplus._M_p = (pointer)paVar8;
  }
  local_1f0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1f0,".");
  paVar7 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar8 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == paVar8) {
    local_1d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_1d0._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_1d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_1d0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_
            (&local_150,(String *)((long)this % 1000 & 0xffffffff),3,(int)paVar8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    uVar9 = local_1d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_150._M_string_length + local_1d0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar9 = local_150.field_2._M_allocated_capacity;
    }
    if (local_150._M_string_length + local_1d0._M_string_length <= (ulong)uVar9) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_150,0,0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      goto LAB_0013fe0c;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1d0,local_150._M_dataplus._M_p,local_150._M_string_length);
LAB_0013fe0c:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar4->_M_dataplus)._M_p;
  paVar8 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar8) {
    uVar9 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar4->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar6) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar5) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss.sss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
         String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
         String::FormatIntWidth2(time_struct.tm_mday) + "T" +
         String::FormatIntWidth2(time_struct.tm_hour) + ":" +
         String::FormatIntWidth2(time_struct.tm_min) + ":" +
         String::FormatIntWidth2(time_struct.tm_sec) + "." +
         String::FormatIntWidthN(static_cast<int>(ms % 1000), 3);
}